

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

ByteData256 * __thiscall
cfd::core::TapBranch::GetBaseHash(ByteData256 *__return_storage_ptr__,TapBranch *this)

{
  int iVar1;
  HashUtil *pHVar2;
  ByteData local_c0;
  ByteData local_a8;
  ByteData local_90;
  HashUtil local_78;
  allocator local_39;
  string local_38 [32];
  TapBranch *local_18;
  TapBranch *this_local;
  
  local_18 = this;
  this_local = (TapBranch *)__return_storage_ptr__;
  if ((this->has_leaf_ & 1U) == 0) {
    ByteData256::ByteData256(__return_storage_ptr__,&this->root_commitment_);
  }
  else {
    if (GetBaseHash()::kTaggedHash == '\0') {
      iVar1 = __cxa_guard_acquire(&GetBaseHash()::kTaggedHash);
      if (iVar1 != 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_38,"TapLeaf",&local_39);
        HashUtil::Sha256(&GetBaseHash::kTaggedHash,(string *)local_38);
        ::std::__cxx11::string::~string(local_38);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
        __cxa_atexit(ByteData256::~ByteData256,&GetBaseHash::kTaggedHash,&__dso_handle);
        __cxa_guard_release(&GetBaseHash()::kTaggedHash);
      }
    }
    HashUtil::HashUtil(&local_78,'\x03');
    pHVar2 = HashUtil::operator<<(&local_78,&GetBaseHash::kTaggedHash);
    pHVar2 = HashUtil::operator<<(pHVar2,&GetBaseHash::kTaggedHash);
    ByteData::ByteData(&local_90,this->leaf_version_);
    pHVar2 = HashUtil::operator<<(pHVar2,&local_90);
    Script::GetData(&local_c0,&this->script_);
    ByteData::Serialize(&local_a8,&local_c0);
    pHVar2 = HashUtil::operator<<(pHVar2,&local_a8);
    HashUtil::Output256(__return_storage_ptr__,pHVar2);
    ByteData::~ByteData(&local_a8);
    ByteData::~ByteData(&local_c0);
    ByteData::~ByteData(&local_90);
    HashUtil::~HashUtil(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 TapBranch::GetBaseHash() const {
  if (!has_leaf_) return root_commitment_;

  static auto kTaggedHash = HashUtil::Sha256("TapLeaf");
  return (HashUtil(HashUtil::kSha256)
          << kTaggedHash << kTaggedHash << ByteData(leaf_version_)
          << script_.GetData().Serialize())
      .Output256();
}